

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBoxHeader(char *label,int items_count,int height_in_items)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  float fVar2;
  ImVec2 size;
  float height_in_items_f;
  ImGuiContext *g;
  ImVec2 *in_stack_000000d0;
  char *in_stack_000000d8;
  int local_28;
  ImVec2 local_24;
  float local_1c;
  ImGuiContext *local_18;
  
  local_18 = GImGui;
  local_28 = in_EDX;
  if (in_EDX < 0) {
    local_28 = ImMin<int>(in_ESI,7);
  }
  local_1c = (float)local_28 + 0.25;
  ImVec2::ImVec2(&local_24);
  local_24.x = 0.0;
  fVar2 = GetTextLineHeightWithSpacing();
  local_24.y = fVar2 * local_1c + (local_18->Style).FramePadding.y * 2.0;
  bVar1 = BeginListBox(in_stack_000000d8,in_stack_000000d0);
  return bVar1;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, int items_count, int height_in_items)
{
    // If height_in_items == -1, default height is maximum 7.
    ImGuiContext& g = *GImGui;
    float height_in_items_f = (height_in_items < 0 ? ImMin(items_count, 7) : height_in_items) + 0.25f;
    ImVec2 size;
    size.x = 0.0f;
    size.y = GetTextLineHeightWithSpacing() * height_in_items_f + g.Style.FramePadding.y * 2.0f;
    return BeginListBox(label, size);
}